

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O0

cmTarget * __thiscall
cmMakefile::AddLibrary
          (cmMakefile *this,string *lname,TargetType type,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *srcs,bool excludeFromAll)

{
  cmTarget *this_00;
  allocator local_91;
  string local_90;
  cmTarget *local_70;
  cmTarget *target;
  allocator local_51;
  string local_50;
  byte local_29;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvStack_28;
  bool excludeFromAll_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *srcs_local;
  string *psStack_18;
  TargetType type_local;
  string *lname_local;
  cmMakefile *this_local;
  
  local_29 = excludeFromAll;
  pvStack_28 = srcs;
  srcs_local._4_4_ = type;
  psStack_18 = lname;
  lname_local = (string *)this;
  if ((((type != STATIC_LIBRARY) && (type != SHARED_LIBRARY)) && (type != MODULE_LIBRARY)) &&
     ((type != OBJECT_LIBRARY && (type != INTERFACE_LIBRARY)))) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_50,"cmMakefile::AddLibrary given invalid target type.",&local_51);
    IssueMessage(this,INTERNAL_ERROR,&local_50);
    std::__cxx11::string::~string((string *)&local_50);
    std::allocator<char>::~allocator((allocator<char> *)&local_51);
    srcs_local._4_4_ = STATIC_LIBRARY;
  }
  local_70 = AddNewTarget(this,srcs_local._4_4_,psStack_18);
  cmTarget::ClearDependencyInformation(local_70,this,psStack_18);
  this_00 = local_70;
  if ((local_29 & 1) != 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_90,"EXCLUDE_FROM_ALL",&local_91);
    cmTarget::SetProperty(this_00,&local_90,"TRUE");
    std::__cxx11::string::~string((string *)&local_90);
    std::allocator<char>::~allocator((allocator<char> *)&local_91);
  }
  cmTarget::AddSources(local_70,pvStack_28);
  AddGlobalLinkInformation(this,psStack_18,local_70);
  return local_70;
}

Assistant:

cmTarget* cmMakefile::AddLibrary(const std::string& lname,
                            cmTarget::TargetType type,
                            const std::vector<std::string> &srcs,
                            bool excludeFromAll)
{
  // wrong type ? default to STATIC
  if (    (type != cmTarget::STATIC_LIBRARY)
       && (type != cmTarget::SHARED_LIBRARY)
       && (type != cmTarget::MODULE_LIBRARY)
       && (type != cmTarget::OBJECT_LIBRARY)
       && (type != cmTarget::INTERFACE_LIBRARY))
    {
    this->IssueMessage(cmake::INTERNAL_ERROR,
                       "cmMakefile::AddLibrary given invalid target type.");
    type = cmTarget::STATIC_LIBRARY;
    }

  cmTarget* target = this->AddNewTarget(type, lname);
  // Clear its dependencies. Otherwise, dependencies might persist
  // over changes in CMakeLists.txt, making the information stale and
  // hence useless.
  target->ClearDependencyInformation( *this, lname );
  if(excludeFromAll)
    {
    target->SetProperty("EXCLUDE_FROM_ALL", "TRUE");
    }
  target->AddSources(srcs);
  this->AddGlobalLinkInformation(lname, *target);
  return target;
}